

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O3

void duckdb::LogQueryPathSetting::SetLocal(ClientContext *context,Value *input)

{
  ClientData *pCVar1;
  FileSystem *fs;
  _Head_base<0UL,_duckdb::BufferedFileWriter_*,_false> this;
  _Head_base<0UL,_duckdb::BufferedFileWriter_*,_false> _Var2;
  FileOpenFlags open_flags;
  string path;
  string local_40;
  
  pCVar1 = ClientData::Get(context);
  Value::ToString_abi_cxx11_(&local_40,input);
  if (local_40._M_string_length == 0) {
    _Var2._M_head_impl =
         (pCVar1->log_query_writer).
         super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BufferedFileWriter_*,_std::default_delete<duckdb::BufferedFileWriter>_>
         .super__Head_base<0UL,_duckdb::BufferedFileWriter_*,_false>._M_head_impl;
    (pCVar1->log_query_writer).
    super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::BufferedFileWriter_*,_std::default_delete<duckdb::BufferedFileWriter>_>
    .super__Head_base<0UL,_duckdb::BufferedFileWriter_*,_false>._M_head_impl =
         (BufferedFileWriter *)0x0;
  }
  else {
    fs = FileSystem::GetFileSystem(context);
    this._M_head_impl = (BufferedFileWriter *)operator_new(0x50);
    open_flags.lock = NO_LOCK;
    open_flags.compression = UNCOMPRESSED;
    open_flags._10_6_ = 0;
    open_flags.flags = 10;
    BufferedFileWriter::BufferedFileWriter(this._M_head_impl,fs,&local_40,open_flags);
    _Var2._M_head_impl =
         (pCVar1->log_query_writer).
         super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BufferedFileWriter_*,_std::default_delete<duckdb::BufferedFileWriter>_>
         .super__Head_base<0UL,_duckdb::BufferedFileWriter_*,_false>._M_head_impl;
    (pCVar1->log_query_writer).
    super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::BufferedFileWriter_*,_std::default_delete<duckdb::BufferedFileWriter>_>
    .super__Head_base<0UL,_duckdb::BufferedFileWriter_*,_false>._M_head_impl = this._M_head_impl;
  }
  if (_Var2._M_head_impl != (BufferedFileWriter *)0x0) {
    (*((_Var2._M_head_impl)->super_WriteStream)._vptr_WriteStream[2])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void LogQueryPathSetting::SetLocal(ClientContext &context, const Value &input) {
	auto &client_data = ClientData::Get(context);
	auto path = input.ToString();
	if (path.empty()) {
		// empty path: clean up query writer
		client_data.log_query_writer = nullptr;
	} else {
		client_data.log_query_writer = make_uniq<BufferedFileWriter>(FileSystem::GetFileSystem(context), path,
		                                                             BufferedFileWriter::DEFAULT_OPEN_FLAGS);
	}
}